

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O1

void __thiscall
ktx::Reporter::warning<std::__cxx11::string_const&>
          (Reporter *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_string_view<char> format_str;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *vargs;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_00;
  pointer local_28;
  size_type sStack_20;
  
  local_28 = (this->commandName)._M_dataplus._M_p;
  sStack_20 = (this->commandName)._M_string_length;
  format_str_00.size_ = 0xc;
  format_str_00.data_ = "{} warning: ";
  args_00.field_1.values_ =
       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_28;
  args_00.desc_ = 0xd;
  ::fmt::v10::vprint<char>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,format_str_00,args_00);
  format_str.data_ = (args->_M_dataplus)._M_p;
  format_str.size_ = args->_M_string_length;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = &local_28;
  ::fmt::v10::vprint<char>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,format_str,
             (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
             (auVar1 << 0x40));
  format_str_01.size_ = 1;
  format_str_01.data_ = "\n";
  auVar2._8_8_ = 0;
  auVar2._0_8_ = &local_28;
  ::fmt::v10::vprint<char>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,format_str_01,
             (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
             (auVar2 << 0x40));
  return;
}

Assistant:

void warning(Args&&... args) {
        fmt::print(std::cerr, "{} warning: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, "\n");
    }